

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_> *field)

{
  EventModuleField *pEVar1;
  _Head_base<0UL,_wabt::EventModuleField_*,_false> local_50;
  Event *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38;
  int iStack_34;
  int iStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  pEVar1 = (field->_M_t).
           super___uniq_ptr_impl<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::EventModuleField_*,_std::default_delete<wabt::EventModuleField>_>
           .super__Head_base<0UL,_wabt::EventModuleField_*,_false>._M_head_impl;
  if ((pEVar1->event).name._M_string_length != 0) {
    local_48 = (Event *)(pEVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).
                        super_ModuleField.loc.filename.data_;
    uStack_40 = (undefined4)
                (pEVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc.
                filename.size_;
    uStack_3c = *(undefined4 *)
                 ((long)&(pEVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).
                         super_ModuleField.loc.filename.size_ + 4);
    local_38 = (pEVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc.
               field_1.field_0.line;
    iStack_34 = (pEVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc.
                field_1.field_0.first_column;
    iStack_30 = (pEVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc.
                field_1.field_0.last_column;
    uStack_2c = *(undefined4 *)
                 ((long)&(pEVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).
                         super_ModuleField.loc.field_1 + 0xc);
    local_28 = (undefined4)
               ((ulong)((long)(this->events).
                              super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->events).
                             super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->event_bindings,&pEVar1->event);
  }
  local_48 = &pEVar1->event;
  std::vector<wabt::Event*,std::allocator<wabt::Event*>>::emplace_back<wabt::Event*>
            ((vector<wabt::Event*,std::allocator<wabt::Event*>> *)&this->events,&local_48);
  local_50._M_head_impl =
       (field->_M_t).
       super___uniq_ptr_impl<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>.
       _M_t.
       super__Tuple_impl<0UL,_wabt::EventModuleField_*,_std::default_delete<wabt::EventModuleField>_>
       .super__Head_base<0UL,_wabt::EventModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::EventModuleField_*,_std::default_delete<wabt::EventModuleField>_>.
  super__Head_base<0UL,_wabt::EventModuleField_*,_false>._M_head_impl = (EventModuleField *)0x0;
  intrusive_list<wabt::ModuleField>::push_back
            (&this->fields,
             (unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *)&local_50);
  if (local_50._M_head_impl != (EventModuleField *)0x0) {
    (*((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField
      ._vptr_ModuleField[1])();
  }
  return;
}

Assistant:

void Module::AppendField(std::unique_ptr<EventModuleField> field) {
  Event& event = field->event;
  if (!event.name.empty()) {
    event_bindings.emplace(event.name, Binding(field->loc, events.size()));
  }
  events.push_back(&event);
  fields.push_back(std::move(field));
}